

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O1

vector<cv::DMatch,_std::allocator<cv::DMatch>_> *
filter_match(vector<cv::DMatch,_std::allocator<cv::DMatch>_> *__return_storage_ptr__,
            vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_model,
            vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test,
            vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
            *matches,double lowe_ratio)

{
  pointer *ppDVar1;
  pointer pvVar2;
  DMatch *__args;
  iterator __position;
  undefined8 uVar3;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> *vals;
  pointer pvVar4;
  
  (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = (matches->
           super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar4 = (matches->
                super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar2; pvVar4 = pvVar4 + 1) {
    __args = (pvVar4->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((double)*(float *)(__args + 0xc) < (double)*(float *)(__args + 0x1c) * lowe_ratio) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cv::DMatch,std::allocator<cv::DMatch>>::_M_realloc_insert<cv::DMatch_const&>
                  ((vector<cv::DMatch,std::allocator<cv::DMatch>> *)__return_storage_ptr__,
                   __position,__args);
      }
      else {
        uVar3 = *(undefined8 *)(__args + 8);
        *(undefined8 *)__position._M_current = *(undefined8 *)__args;
        *(undefined8 *)(__position._M_current + 8) = uVar3;
        ppDVar1 = &(__return_storage_ptr__->
                   super__Vector_base<cv::DMatch,_std::allocator<cv::DMatch>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 0x10;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::DMatch> filter_match(const std::vector<cv::KeyPoint>& keypoint_model,
    const std::vector<cv::KeyPoint>& keypoint_test, const std::vector<std::vector<cv::DMatch>>& matches,
    double lowe_ratio)
{
    std::vector<cv::DMatch> result;
    for(const auto& vals : matches)
    {
        if(vals[0].distance < lowe_ratio * vals[1].distance)
        {
            result.push_back(vals[0]);
        }
    }
    return result;
}